

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O3

char * __thiscall
gl3cts::TransformFeedbackOverflowQueryMultipleStreamsOneBufferPerStream::
transformFeedbackGeometryShader
          (TransformFeedbackOverflowQueryMultipleStreamsOneBufferPerStream *this)

{
  return 
  "#version 150 core\n#extension GL_ARB_gpu_shader5 : require\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout(stream=0) out float output1;\nlayout(stream=1) out float output2;\nlayout(stream=2) out float output3;\nlayout(stream=3) out float output4;\nuniform uint stream;\nvoid main() {\n    if (stream == 0) {\n        output1 = 1.0;\n        EmitStreamVertex(0);\n        EndStreamPrimitive(0);\n    }\n    if (stream == 1) {\n        output2 = 2.0;\n        EmitStreamVertex(1);\n        EndStreamPrimitive(1);\n    }\n    if (stream == 2) {\n        output3 = 3.0;\n        EmitStreamVertex(2);\n        EndStreamPrimitive(2);\n    }\n    if (stream == 3) {\n        output4 = 4.0;\n        EmitStreamVertex(3);\n        EndStreamPrimitive(3);\n    }\n}"
  ;
}

Assistant:

virtual const char* transformFeedbackGeometryShader()
	{
		return "#version 150 core\n"
			   "#extension GL_ARB_gpu_shader5 : require\n"
			   "layout(points) in;\n"
			   "layout(points, max_vertices = 1) out;\n"
			   "layout(stream=0) out float output1;\n"
			   "layout(stream=1) out float output2;\n"
			   "layout(stream=2) out float output3;\n"
			   "layout(stream=3) out float output4;\n"
			   "uniform uint stream;\n"
			   "void main() {\n"
			   "    if (stream == 0) {\n"
			   "        output1 = 1.0;\n"
			   "        EmitStreamVertex(0);\n"
			   "        EndStreamPrimitive(0);\n"
			   "    }\n"
			   "    if (stream == 1) {\n"
			   "        output2 = 2.0;\n"
			   "        EmitStreamVertex(1);\n"
			   "        EndStreamPrimitive(1);\n"
			   "    }\n"
			   "    if (stream == 2) {\n"
			   "        output3 = 3.0;\n"
			   "        EmitStreamVertex(2);\n"
			   "        EndStreamPrimitive(2);\n"
			   "    }\n"
			   "    if (stream == 3) {\n"
			   "        output4 = 4.0;\n"
			   "        EmitStreamVertex(3);\n"
			   "        EndStreamPrimitive(3);\n"
			   "    }\n"
			   "}";
	}